

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O1

MPP_RET mpp_enc_refs_set_usr_cfg(MppEncRefs refs,MppEncRefFrmUsrCfg *cfg)

{
  RK_U32 RVar1;
  RK_S32 RVar2;
  RK_S32 RVar3;
  RK_S32 RVar4;
  RK_S32 RVar5;
  MppEncRefMode MVar6;
  RK_S32 RVar7;
  MPP_RET MVar8;
  
  if (refs == (MppEncRefs)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid NULL input refs\n","mpp_enc_refs_set_usr_cfg");
    MVar8 = MPP_ERR_VALUE;
  }
  else {
    if (((byte)enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_set_usr_cfg",refs);
    }
    RVar1 = cfg->force_flag;
    RVar2 = cfg->force_idr;
    RVar3 = cfg->force_pskip;
    RVar4 = cfg->force_nonref;
    RVar5 = cfg->force_temporal_id;
    MVar6 = cfg->force_ref_mode;
    RVar7 = cfg->force_ref_arg;
    *(RK_S32 *)((long)refs + 0x20) = cfg->force_lt_idx;
    *(RK_S32 *)((long)refs + 0x24) = RVar5;
    *(MppEncRefMode *)((long)refs + 0x28) = MVar6;
    *(RK_S32 *)((long)refs + 0x2c) = RVar7;
    *(RK_U32 *)((long)refs + 0x10) = RVar1;
    *(RK_S32 *)((long)refs + 0x14) = RVar2;
    *(RK_S32 *)((long)refs + 0x18) = RVar3;
    *(RK_S32 *)((long)refs + 0x1c) = RVar4;
    if (cfg->force_flag != 0) {
      *(byte *)refs = *refs | 2;
    }
    MVar8 = MPP_OK;
    if (((byte)enc_refs_debug & 1) != 0) {
      MVar8 = MPP_OK;
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_set_usr_cfg",refs);
    }
  }
  return MVar8;
}

Assistant:

MPP_RET mpp_enc_refs_set_usr_cfg(MppEncRefs refs, MppEncRefFrmUsrCfg *cfg)
{
    if (NULL == refs) {
        mpp_err_f("invalid NULL input refs\n");
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    memcpy(&p->usr_cfg, cfg, sizeof(p->usr_cfg));
    if (cfg->force_flag)
        p->changed |= ENC_REFS_USR_CFG_CHANGED;

    enc_refs_dbg_func("leave %p\n", refs);
    return MPP_OK;
}